

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

round_direction
fmt::v7::detail::get_round_direction(uint64_t divisor,uint64_t remainder,uint64_t error)

{
  uint64_t error_local;
  uint64_t remainder_local;
  uint64_t divisor_local;
  
  if (divisor <= remainder) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                ,0x305,"");
  }
  if (error < divisor) {
    if (error < divisor - error) {
      if ((divisor - remainder < remainder) || (divisor + remainder * -2 < error * 2)) {
        if ((remainder < error) || (remainder - error < divisor - (remainder - error))) {
          divisor_local._4_4_ = unknown;
        }
        else {
          divisor_local._4_4_ = up;
        }
      }
      else {
        divisor_local._4_4_ = down;
      }
      return divisor_local._4_4_;
    }
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                ,0x307,"");
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
              ,0x306,"");
}

Assistant:

inline round_direction get_round_direction(uint64_t divisor, uint64_t remainder,
                                           uint64_t error) {
  FMT_ASSERT(remainder < divisor, "");  // divisor - remainder won't overflow.
  FMT_ASSERT(error < divisor, "");      // divisor - error won't overflow.
  FMT_ASSERT(error < divisor - error, "");  // error * 2 won't overflow.
  // Round down if (remainder + error) * 2 <= divisor.
  if (remainder <= divisor - remainder && error * 2 <= divisor - remainder * 2)
    return round_direction::down;
  // Round up if (remainder - error) * 2 >= divisor.
  if (remainder >= error &&
      remainder - error >= divisor - (remainder - error)) {
    return round_direction::up;
  }
  return round_direction::unknown;
}